

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O1

void QGraphicsSceneBspTreeIndexPrivate::sortItems
               (QList<QGraphicsItem_*> *itemList,SortOrder order,bool sortCacheEnabled,
               bool onlyTopLevelItems)

{
  qreal *pqVar1;
  QGraphicsItem **ppQVar2;
  long lVar3;
  double dVar4;
  int iVar5;
  QGraphicsItem *pQVar6;
  QGraphicsItemPrivate *pQVar7;
  QGraphicsItemPrivate *pQVar8;
  iterator iVar9;
  iterator iVar10;
  ulong uVar11;
  QGraphicsItem **ppQVar12;
  iterator iVar13;
  iterator iVar14;
  uint uVar15;
  QGraphicsItem **ppQVar16;
  QGraphicsItem **ppQVar17;
  iterator __i;
  QGraphicsItem **ppQVar18;
  long lVar19;
  long lVar20;
  value_type __val_18;
  size_t sVar21;
  value_type __val_16;
  value_type __val;
  bool bVar22;
  
  if (order != ~AscendingOrder) {
    if (onlyTopLevelItems) {
      if (order == AscendingOrder) {
        iVar9 = QList<QGraphicsItem_*>::begin(itemList);
        iVar10 = QList<QGraphicsItem_*>::end(itemList);
        if (iVar9.i != iVar10.i) {
          uVar11 = (long)iVar10.i - (long)iVar9.i >> 3;
          lVar20 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar20 == 0; lVar20 = lVar20 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                    (iVar9,iVar10,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                     0x5fb098);
          ppQVar18 = iVar9.i + 1;
          iVar13 = iVar9;
          if ((long)iVar10.i - (long)iVar9.i < 0x81) {
            for (; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
              pQVar6 = *ppQVar18;
              pQVar7 = ((*iVar9.i)->d_ptr).d;
              pQVar8 = (pQVar6->d_ptr).d;
              uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
              uVar15 = (uint)(uVar11 >> 0x28);
              if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) == uVar15) {
                dVar4 = pQVar7->z;
                pqVar1 = &pQVar8->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                }
              }
              else {
                bVar22 = uVar11 != 0;
              }
              if (bVar22) {
                lVar20 = (long)ppQVar18 - (long)iVar9.i >> 3;
                iVar14 = iVar9;
                if (0 < lVar20) {
                  lVar19 = 1;
                  do {
                    iVar13.i[lVar19] = iVar13.i[lVar19 + -1];
                    lVar3 = lVar20 + lVar19;
                    lVar19 = lVar19 + -1;
                  } while (1 < lVar3 + -1);
                }
              }
              else {
                pQVar7 = ((*iVar13.i)->d_ptr).d;
                if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) == uVar15) {
                  dVar4 = pQVar7->z;
                  pqVar1 = &pQVar8->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                  }
                }
                else {
                  bVar22 = uVar11 != 0;
                }
                iVar14.i = ppQVar18;
                ppQVar16 = ppQVar18;
                if (bVar22) {
                  do {
                    *ppQVar16 = ppQVar16[-1];
                    pQVar7 = (ppQVar16[-2]->d_ptr).d;
                    pQVar8 = (pQVar6->d_ptr).d;
                    uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                    if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                        (uint)(uVar11 >> 0x28)) {
                      dVar4 = pQVar7->z;
                      pqVar1 = &pQVar8->z;
                      if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                        bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                      }
                      else {
                        bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                      }
                    }
                    else {
                      bVar22 = uVar11 != 0;
                    }
                    iVar14.i = ppQVar16 + -1;
                    ppQVar16 = ppQVar16 + -1;
                  } while (bVar22);
                }
              }
              *iVar14.i = pQVar6;
              iVar13.i = iVar13.i + 1;
            }
          }
          else {
            sVar21 = 8;
            ppQVar16 = ppQVar18;
            do {
              pQVar6 = *(QGraphicsItem **)((long)iVar9.i + sVar21);
              pQVar7 = ((*iVar9.i)->d_ptr).d;
              pQVar8 = (pQVar6->d_ptr).d;
              uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
              uVar15 = (uint)(uVar11 >> 0x28);
              if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) == uVar15) {
                dVar4 = pQVar7->z;
                pqVar1 = &pQVar8->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                }
              }
              else {
                bVar22 = uVar11 != 0;
              }
              ppQVar17 = iVar9.i + sVar21;
              if (bVar22) {
                memmove(ppQVar18,iVar9.i,sVar21);
                iVar13 = iVar9;
              }
              else {
                pQVar7 = ((*iVar13.i)->d_ptr).d;
                if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) == uVar15) {
                  dVar4 = pQVar7->z;
                  pqVar1 = &pQVar8->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                  }
                }
                else {
                  bVar22 = uVar11 != 0;
                }
                iVar13.i = ppQVar17;
                ppQVar12 = ppQVar16;
                if (bVar22) {
                  do {
                    *ppQVar12 = ppQVar12[-1];
                    pQVar7 = (ppQVar12[-2]->d_ptr).d;
                    pQVar8 = (pQVar6->d_ptr).d;
                    uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                    if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                        (uint)(uVar11 >> 0x28)) {
                      dVar4 = pQVar7->z;
                      pqVar1 = &pQVar8->z;
                      if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                        bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                      }
                      else {
                        bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                      }
                    }
                    else {
                      bVar22 = uVar11 != 0;
                    }
                    iVar13.i = ppQVar12 + -1;
                    ppQVar12 = iVar13.i;
                  } while (bVar22);
                }
              }
              *iVar13.i = pQVar6;
              sVar21 = sVar21 + 8;
              ppQVar16 = ppQVar16 + 1;
              iVar13.i = ppQVar17;
            } while (sVar21 != 0x80);
            for (ppQVar18 = iVar9.i + 0x10; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
              pQVar6 = *ppQVar18;
              pQVar7 = (ppQVar18[-1]->d_ptr).d;
              pQVar8 = (pQVar6->d_ptr).d;
              uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
              if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                  (uint)(uVar11 >> 0x28)) {
                dVar4 = pQVar7->z;
                pqVar1 = &pQVar8->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                }
              }
              else {
                bVar22 = uVar11 != 0;
              }
              ppQVar16 = ppQVar18;
              if (bVar22) {
                do {
                  *ppQVar16 = ppQVar16[-1];
                  pQVar7 = (ppQVar16[-2]->d_ptr).d;
                  pQVar8 = (pQVar6->d_ptr).d;
                  uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                  if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar11 >> 0x28)) {
                    dVar4 = pQVar7->z;
                    pqVar1 = &pQVar8->z;
                    if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                      bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                    }
                    else {
                      bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                    }
                  }
                  else {
                    bVar22 = uVar11 != 0;
                  }
                  ppQVar16 = ppQVar16 + -1;
                } while (bVar22);
              }
              *ppQVar16 = pQVar6;
            }
          }
        }
      }
      else if (order == DescendingOrder) {
        iVar9 = QList<QGraphicsItem_*>::begin(itemList);
        iVar10 = QList<QGraphicsItem_*>::end(itemList);
        if (iVar9.i != iVar10.i) {
          uVar11 = (long)iVar10.i - (long)iVar9.i >> 3;
          lVar20 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar20 == 0; lVar20 = lVar20 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                    (iVar9,iVar10,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                     0x6340a9);
          ppQVar18 = iVar9.i + 1;
          iVar13 = iVar9;
          if ((long)iVar10.i - (long)iVar9.i < 0x81) {
            for (; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
              pQVar6 = *ppQVar18;
              pQVar7 = (pQVar6->d_ptr).d;
              pQVar8 = ((*iVar9.i)->d_ptr).d;
              uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
              uVar15 = (uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1;
              if (uVar15 == (uint)(uVar11 >> 0x28)) {
                dVar4 = pQVar7->z;
                pqVar1 = &pQVar8->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                }
              }
              else {
                bVar22 = uVar11 != 0;
              }
              if (bVar22) {
                lVar20 = (long)ppQVar18 - (long)iVar9.i >> 3;
                iVar14 = iVar9;
                if (0 < lVar20) {
                  lVar19 = 1;
                  do {
                    iVar13.i[lVar19] = iVar13.i[lVar19 + -1];
                    lVar3 = lVar20 + lVar19;
                    lVar19 = lVar19 + -1;
                  } while (1 < lVar3 + -1);
                }
              }
              else {
                pQVar8 = ((*iVar13.i)->d_ptr).d;
                uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                if (uVar15 == (uint)(uVar11 >> 0x28)) {
                  dVar4 = pQVar7->z;
                  pqVar1 = &pQVar8->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                  }
                }
                else {
                  bVar22 = uVar11 != 0;
                }
                iVar14.i = ppQVar18;
                ppQVar16 = ppQVar18;
                if (bVar22) {
                  do {
                    *ppQVar16 = ppQVar16[-1];
                    pQVar7 = (pQVar6->d_ptr).d;
                    pQVar8 = (ppQVar16[-2]->d_ptr).d;
                    uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                    if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                        (uint)(uVar11 >> 0x28)) {
                      dVar4 = pQVar7->z;
                      pqVar1 = &pQVar8->z;
                      if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                        bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                      }
                      else {
                        bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                      }
                    }
                    else {
                      bVar22 = uVar11 != 0;
                    }
                    iVar14.i = ppQVar16 + -1;
                    ppQVar16 = ppQVar16 + -1;
                  } while (bVar22);
                }
              }
              *iVar14.i = pQVar6;
              iVar13.i = iVar13.i + 1;
            }
          }
          else {
            sVar21 = 8;
            ppQVar16 = ppQVar18;
            do {
              pQVar6 = *(QGraphicsItem **)((long)iVar9.i + sVar21);
              pQVar7 = (pQVar6->d_ptr).d;
              pQVar8 = ((*iVar9.i)->d_ptr).d;
              uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
              uVar15 = (uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1;
              if (uVar15 == (uint)(uVar11 >> 0x28)) {
                dVar4 = pQVar7->z;
                pqVar1 = &pQVar8->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                }
              }
              else {
                bVar22 = uVar11 != 0;
              }
              ppQVar17 = iVar9.i + sVar21;
              if (bVar22) {
                memmove(ppQVar18,iVar9.i,sVar21);
                iVar13 = iVar9;
              }
              else {
                pQVar8 = ((*iVar13.i)->d_ptr).d;
                uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                if (uVar15 == (uint)(uVar11 >> 0x28)) {
                  dVar4 = pQVar7->z;
                  pqVar1 = &pQVar8->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                  }
                }
                else {
                  bVar22 = uVar11 != 0;
                }
                iVar13.i = ppQVar17;
                ppQVar12 = ppQVar16;
                if (bVar22) {
                  do {
                    *ppQVar12 = ppQVar12[-1];
                    pQVar7 = (pQVar6->d_ptr).d;
                    pQVar8 = (ppQVar12[-2]->d_ptr).d;
                    uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                    if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                        (uint)(uVar11 >> 0x28)) {
                      dVar4 = pQVar7->z;
                      pqVar1 = &pQVar8->z;
                      if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                        bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                      }
                      else {
                        bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                      }
                    }
                    else {
                      bVar22 = uVar11 != 0;
                    }
                    iVar13.i = ppQVar12 + -1;
                    ppQVar12 = iVar13.i;
                  } while (bVar22);
                }
              }
              *iVar13.i = pQVar6;
              sVar21 = sVar21 + 8;
              ppQVar16 = ppQVar16 + 1;
              iVar13.i = ppQVar17;
            } while (sVar21 != 0x80);
            for (ppQVar18 = iVar9.i + 0x10; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
              pQVar6 = *ppQVar18;
              pQVar7 = (pQVar6->d_ptr).d;
              pQVar8 = (ppQVar18[-1]->d_ptr).d;
              uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
              if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                  (uint)(uVar11 >> 0x28)) {
                dVar4 = pQVar7->z;
                pqVar1 = &pQVar8->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                }
              }
              else {
                bVar22 = uVar11 != 0;
              }
              ppQVar16 = ppQVar18;
              if (bVar22) {
                do {
                  *ppQVar16 = ppQVar16[-1];
                  pQVar7 = (pQVar6->d_ptr).d;
                  pQVar8 = (ppQVar16[-2]->d_ptr).d;
                  uVar11 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                  if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                      (uint)(uVar11 >> 0x28)) {
                    dVar4 = pQVar7->z;
                    pqVar1 = &pQVar8->z;
                    if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                      bVar22 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                    }
                    else {
                      bVar22 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                    }
                  }
                  else {
                    bVar22 = uVar11 != 0;
                  }
                  ppQVar16 = ppQVar16 + -1;
                } while (bVar22);
              }
              *ppQVar16 = pQVar6;
            }
          }
        }
      }
    }
    else if (sortCacheEnabled) {
      if (order == AscendingOrder) {
        iVar9 = QList<QGraphicsItem_*>::begin(itemList);
        iVar10 = QList<QGraphicsItem_*>::end(itemList);
        if (iVar9.i != iVar10.i) {
          uVar11 = (long)iVar10.i - (long)iVar9.i >> 3;
          lVar20 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar20 == 0; lVar20 = lVar20 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                    (iVar9,iVar10,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                     0x634124);
          ppQVar18 = iVar9.i + 1;
          iVar13 = iVar9;
          if ((long)iVar10.i - (long)iVar9.i < 0x81) {
            for (; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
              pQVar6 = *ppQVar18;
              iVar5 = ((pQVar6->d_ptr).d)->globalStackingOrder;
              if (iVar5 < (((*iVar9.i)->d_ptr).d)->globalStackingOrder) {
                iVar14.i = ppQVar18;
                ppQVar16 = ppQVar18;
                if ((((*iVar13.i)->d_ptr).d)->globalStackingOrder <= iVar5) {
                  do {
                    iVar14.i = ppQVar16 + -1;
                    ppQVar17 = ppQVar16 + -2;
                    *ppQVar16 = ppQVar16[-1];
                    ppQVar16 = iVar14.i;
                  } while ((((*ppQVar17)->d_ptr).d)->globalStackingOrder <=
                           ((pQVar6->d_ptr).d)->globalStackingOrder);
                }
              }
              else {
                lVar20 = (long)ppQVar18 - (long)iVar9.i >> 3;
                iVar14 = iVar9;
                if (0 < lVar20) {
                  lVar19 = 1;
                  do {
                    iVar13.i[lVar19] = iVar13.i[lVar19 + -1];
                    lVar3 = lVar20 + lVar19;
                    lVar19 = lVar19 + -1;
                  } while (1 < lVar3 + -1);
                }
              }
              *iVar14.i = pQVar6;
              iVar13.i = iVar13.i + 1;
            }
          }
          else {
            sVar21 = 8;
            ppQVar16 = ppQVar18;
            do {
              ppQVar17 = iVar9.i + sVar21;
              pQVar6 = *(QGraphicsItem **)((long)iVar9.i + sVar21);
              iVar5 = ((pQVar6->d_ptr).d)->globalStackingOrder;
              if (iVar5 < (((*iVar9.i)->d_ptr).d)->globalStackingOrder) {
                iVar14.i = ppQVar17;
                ppQVar12 = ppQVar16;
                if ((((*iVar13.i)->d_ptr).d)->globalStackingOrder <= iVar5) {
                  do {
                    iVar14.i = ppQVar12 + -1;
                    ppQVar2 = ppQVar12 + -2;
                    *ppQVar12 = ppQVar12[-1];
                    ppQVar12 = iVar14.i;
                  } while ((((*ppQVar2)->d_ptr).d)->globalStackingOrder <=
                           ((pQVar6->d_ptr).d)->globalStackingOrder);
                }
              }
              else {
                memmove(ppQVar18,iVar9.i,sVar21);
                iVar14 = iVar9;
              }
              *iVar14.i = pQVar6;
              sVar21 = sVar21 + 8;
              ppQVar16 = ppQVar16 + 1;
              iVar13.i = ppQVar17;
            } while (sVar21 != 0x80);
            for (ppQVar18 = iVar9.i + 0x10; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
              pQVar6 = *ppQVar18;
              ppQVar16 = ppQVar18;
              ppQVar17 = ppQVar18;
              if (((ppQVar18[-1]->d_ptr).d)->globalStackingOrder <=
                  ((pQVar6->d_ptr).d)->globalStackingOrder) {
                do {
                  ppQVar16 = ppQVar17 + -1;
                  ppQVar12 = ppQVar17 + -2;
                  *ppQVar17 = ppQVar17[-1];
                  ppQVar17 = ppQVar16;
                } while ((((*ppQVar12)->d_ptr).d)->globalStackingOrder <=
                         ((pQVar6->d_ptr).d)->globalStackingOrder);
              }
              *ppQVar16 = pQVar6;
            }
          }
        }
      }
      else if (order == DescendingOrder) {
        iVar9 = QList<QGraphicsItem_*>::begin(itemList);
        iVar10 = QList<QGraphicsItem_*>::end(itemList);
        if (iVar9.i != iVar10.i) {
          uVar11 = (long)iVar10.i - (long)iVar9.i >> 3;
          lVar20 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar20 == 0; lVar20 = lVar20 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                    (iVar9,iVar10,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                     0x634108);
          ppQVar18 = iVar9.i + 1;
          iVar13 = iVar9;
          if ((long)iVar10.i - (long)iVar9.i < 0x81) {
            for (; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
              pQVar6 = *ppQVar18;
              iVar5 = ((pQVar6->d_ptr).d)->globalStackingOrder;
              if (iVar5 < (((*iVar9.i)->d_ptr).d)->globalStackingOrder) {
                lVar20 = (long)ppQVar18 - (long)iVar9.i >> 3;
                iVar14 = iVar9;
                if (0 < lVar20) {
                  lVar19 = 1;
                  do {
                    iVar13.i[lVar19] = iVar13.i[lVar19 + -1];
                    lVar3 = lVar20 + lVar19;
                    lVar19 = lVar19 + -1;
                  } while (1 < lVar3 + -1);
                }
              }
              else {
                iVar14.i = ppQVar18;
                ppQVar16 = ppQVar18;
                if (iVar5 < (((*iVar13.i)->d_ptr).d)->globalStackingOrder) {
                  do {
                    ppQVar17 = ppQVar16 + -2;
                    *ppQVar16 = ppQVar16[-1];
                    iVar14.i = ppQVar16 + -1;
                    ppQVar16 = ppQVar16 + -1;
                  } while (((pQVar6->d_ptr).d)->globalStackingOrder <
                           (((*ppQVar17)->d_ptr).d)->globalStackingOrder);
                }
              }
              *iVar14.i = pQVar6;
              iVar13.i = iVar13.i + 1;
            }
          }
          else {
            sVar21 = 8;
            ppQVar16 = ppQVar18;
            do {
              ppQVar17 = iVar9.i + sVar21;
              pQVar6 = *(QGraphicsItem **)((long)iVar9.i + sVar21);
              iVar5 = ((pQVar6->d_ptr).d)->globalStackingOrder;
              if (iVar5 < (((*iVar9.i)->d_ptr).d)->globalStackingOrder) {
                memmove(ppQVar18,iVar9.i,sVar21);
                iVar14 = iVar9;
              }
              else {
                iVar14.i = ppQVar17;
                ppQVar12 = ppQVar16;
                if (iVar5 < (((*iVar13.i)->d_ptr).d)->globalStackingOrder) {
                  do {
                    iVar14.i = ppQVar12 + -1;
                    ppQVar2 = ppQVar12 + -2;
                    *ppQVar12 = ppQVar12[-1];
                    ppQVar12 = iVar14.i;
                  } while (((pQVar6->d_ptr).d)->globalStackingOrder <
                           (((*ppQVar2)->d_ptr).d)->globalStackingOrder);
                }
              }
              *iVar14.i = pQVar6;
              sVar21 = sVar21 + 8;
              ppQVar16 = ppQVar16 + 1;
              iVar13.i = ppQVar17;
            } while (sVar21 != 0x80);
            for (ppQVar18 = iVar9.i + 0x10; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
              pQVar6 = *ppQVar18;
              ppQVar16 = ppQVar18;
              ppQVar17 = ppQVar18;
              if (((pQVar6->d_ptr).d)->globalStackingOrder <
                  ((ppQVar18[-1]->d_ptr).d)->globalStackingOrder) {
                do {
                  ppQVar16 = ppQVar17 + -1;
                  ppQVar12 = ppQVar17 + -2;
                  *ppQVar17 = ppQVar17[-1];
                  ppQVar17 = ppQVar16;
                } while (((pQVar6->d_ptr).d)->globalStackingOrder <
                         (((*ppQVar12)->d_ptr).d)->globalStackingOrder);
              }
              *ppQVar16 = pQVar6;
            }
          }
        }
      }
    }
    else if (order == AscendingOrder) {
      iVar9 = QList<QGraphicsItem_*>::begin(itemList);
      iVar10 = QList<QGraphicsItem_*>::end(itemList);
      if (iVar9.i != iVar10.i) {
        uVar11 = (long)iVar10.i - (long)iVar9.i >> 3;
        lVar20 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (iVar9,iVar10,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x634140
                  );
        ppQVar18 = iVar9.i + 1;
        iVar13 = iVar9;
        if ((long)iVar10.i - (long)iVar9.i < 0x81) {
          for (; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
            bVar22 = qt_closestItemFirst(*iVar9.i,*ppQVar18);
            pQVar6 = *ppQVar18;
            if (bVar22) {
              lVar20 = (long)ppQVar18 - (long)iVar9.i >> 3;
              iVar14 = iVar9;
              if (0 < lVar20) {
                lVar19 = 1;
                do {
                  iVar13.i[lVar19] = iVar13.i[lVar19 + -1];
                  lVar3 = lVar20 + lVar19;
                  lVar19 = lVar19 + -1;
                } while (1 < lVar3 + -1);
              }
            }
            else {
              bVar22 = qt_closestItemFirst(*iVar13.i,pQVar6);
              ppQVar16 = ppQVar18;
              iVar14.i = ppQVar18;
              if (bVar22) {
                do {
                  iVar14.i = ppQVar16 + -1;
                  *ppQVar16 = ppQVar16[-1];
                  bVar22 = qt_closestItemFirst(ppQVar16[-2],pQVar6);
                  ppQVar16 = iVar14.i;
                } while (bVar22);
              }
            }
            *iVar14.i = pQVar6;
            iVar13.i = iVar13.i + 1;
          }
        }
        else {
          sVar21 = 8;
          ppQVar16 = ppQVar18;
          do {
            ppQVar17 = iVar9.i + sVar21;
            bVar22 = qt_closestItemFirst(*iVar9.i,*(QGraphicsItem **)((long)iVar9.i + sVar21));
            pQVar6 = *(QGraphicsItem **)((long)iVar9.i + sVar21);
            if (bVar22) {
              memmove(ppQVar18,iVar9.i,sVar21);
              iVar13 = iVar9;
            }
            else {
              bVar22 = qt_closestItemFirst(*iVar13.i,pQVar6);
              ppQVar12 = ppQVar16;
              iVar13.i = ppQVar17;
              if (bVar22) {
                do {
                  iVar13.i = ppQVar12 + -1;
                  *ppQVar12 = ppQVar12[-1];
                  bVar22 = qt_closestItemFirst(ppQVar12[-2],pQVar6);
                  ppQVar12 = iVar13.i;
                } while (bVar22);
              }
            }
            *iVar13.i = pQVar6;
            sVar21 = sVar21 + 8;
            ppQVar16 = ppQVar16 + 1;
            iVar13.i = ppQVar17;
          } while (sVar21 != 0x80);
          for (ppQVar18 = iVar9.i + 0x10; ppQVar18 != iVar10.i; ppQVar18 = ppQVar18 + 1) {
            pQVar6 = *ppQVar18;
            bVar22 = qt_closestItemFirst(ppQVar18[-1],pQVar6);
            ppQVar17 = ppQVar18;
            ppQVar16 = ppQVar18;
            if (bVar22) {
              do {
                ppQVar16 = ppQVar17 + -1;
                *ppQVar17 = ppQVar17[-1];
                bVar22 = qt_closestItemFirst(ppQVar17[-2],pQVar6);
                ppQVar17 = ppQVar16;
              } while (bVar22);
            }
            *ppQVar16 = pQVar6;
          }
        }
      }
    }
    else if (order == DescendingOrder) {
      iVar9 = QList<QGraphicsItem_*>::begin(itemList);
      iVar10 = QList<QGraphicsItem_*>::end(itemList);
      if (iVar9.i != iVar10.i) {
        uVar11 = (long)iVar10.i - (long)iVar9.i >> 3;
        lVar20 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (iVar9,iVar10,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5fa2e1
                  );
        std::
        __final_insertion_sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (iVar9,iVar10,
                   (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5fa2e1
                  );
        return;
      }
    }
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::sortItems(QList<QGraphicsItem *> *itemList, Qt::SortOrder order,
                                                  bool sortCacheEnabled, bool onlyTopLevelItems)
{
    if (order == Qt::SortOrder(-1))
        return;

    if (onlyTopLevelItems) {
        if (order == Qt::DescendingOrder)
            std::sort(itemList->begin(), itemList->end(), qt_closestLeaf);
        else if (order == Qt::AscendingOrder)
            std::sort(itemList->begin(), itemList->end(), qt_notclosestLeaf);
        return;
    }

    if (sortCacheEnabled) {
        if (order == Qt::DescendingOrder) {
            std::sort(itemList->begin(), itemList->end(), closestItemFirst_withCache);
        } else if (order == Qt::AscendingOrder) {
            std::sort(itemList->begin(), itemList->end(), closestItemLast_withCache);
        }
    } else {
        if (order == Qt::DescendingOrder) {
            std::sort(itemList->begin(), itemList->end(), qt_closestItemFirst);
        } else if (order == Qt::AscendingOrder) {
            std::sort(itemList->begin(), itemList->end(), qt_closestItemLast);
        }
    }
}